

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv_test.cc
# Opt level: O1

void __thiscall
leveldb::MemEnvTest_OverwriteOpenFile_Test::TestBody(MemEnvTest_OverwriteOpenFile_Test *this)

{
  Env *pEVar1;
  size_t sVar2;
  uint uVar3;
  long *plVar4;
  undefined8 *puVar5;
  int line;
  size_type *psVar6;
  undefined8 *puVar7;
  char *pcVar8;
  uint uVar9;
  AssertHelper *this_00;
  AssertionResult gtest_ar_3;
  Slice result;
  char kWrite2Data [14];
  RandomAccessFile *rand_file;
  char scratch [13];
  string kTestFileName;
  char kWrite1Data [14];
  Slice local_c8;
  Message local_b8;
  char *local_b0;
  undefined8 *local_a8;
  char local_a0 [16];
  AssertHelper local_90;
  AssertHelper local_88;
  undefined6 uStack_80;
  long *local_78;
  AssertHelper local_70 [2];
  string local_60;
  AssertHelper local_40;
  undefined6 uStack_38;
  
  uStack_38 = 0x6174616420;
  local_40.data_._0_6_ = 0x206574697257;
  local_40.data_._6_2_ = 0x3123;
  testing::TempDir_abi_cxx11_();
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_60.field_2._M_allocated_capacity = *psVar6;
    local_60.field_2._8_8_ = plVar4[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar6;
    local_60._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_60._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  pEVar1 = (this->super_MemEnvTest).env_;
  local_c8.data_ = (char *)&local_40;
  local_c8.size_ = strlen(local_c8.data_);
  WriteStringToFile((leveldb *)&local_88,pEVar1,&local_c8,&local_60);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_b0,(char *)local_70
             ,(Status *)"WriteStringToFile(env_, kWrite1Data, kTestFileName)");
  if ((void *)CONCAT26(local_88.data_._6_2_,local_88.data_._0_6_) != (void *)0x0) {
    operator_delete__((void *)CONCAT26(local_88.data_._6_2_,local_88.data_._0_6_));
  }
  puVar7 = local_a8;
  if (local_b0._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_a8 == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (char *)*local_a8;
    }
    this_00 = &local_88;
    line = 0xc6;
LAB_0010f324:
    testing::internal::AssertHelper::AssertHelper
              (this_00,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
               ,line,pcVar8);
    testing::internal::AssertHelper::operator=(this_00,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    puVar7 = local_a8;
    if ((AssertHelper *)local_c8.data_ != (AssertHelper *)0x0) {
      (*(code *)(*(AssertHelperData **)local_c8.data_)->file)();
      puVar7 = local_a8;
    }
  }
  else {
    if (local_a8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_a8 != local_a8 + 2) {
        operator_delete((undefined8 *)*local_a8);
      }
      operator_delete(puVar7);
    }
    pEVar1 = (this->super_MemEnvTest).env_;
    (*pEVar1->_vptr_Env[3])(&local_c8,pEVar1,&local_60,&local_78);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_b0,
               (char *)&local_88,(Status *)"env_->NewRandomAccessFile(kTestFileName, &rand_file)");
    if ((AssertHelper *)local_c8.data_ != (AssertHelper *)0x0) {
      operator_delete__(local_c8.data_);
    }
    puVar7 = local_a8;
    if (local_b0._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
      testing::Message::Message((Message *)&local_c8);
      if (local_a8 == (undefined8 *)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = (char *)*local_a8;
      }
      this_00 = &local_88;
      line = 0xc9;
      goto LAB_0010f324;
    }
    if (local_a8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_a8 != local_a8 + 2) {
        operator_delete((undefined8 *)*local_a8);
      }
      operator_delete(puVar7);
    }
    uStack_80 = 0x6174616420;
    local_88.data_._0_6_ = 0x206574697257;
    local_88.data_._6_2_ = 0x3223;
    pEVar1 = (this->super_MemEnvTest).env_;
    local_c8.data_ = (char *)&local_88;
    local_c8.size_ = strlen((char *)&local_88);
    WriteStringToFile((leveldb *)local_70,pEVar1,&local_c8,&local_60);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_b0,
               (char *)&local_b8,(Status *)"WriteStringToFile(env_, kWrite2Data, kTestFileName)");
    if (local_70[0].data_ != (AssertHelperData *)0x0) {
      operator_delete__(local_70[0].data_);
    }
    if (local_b0._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
      testing::Message::Message((Message *)&local_c8);
      if (local_a8 == (undefined8 *)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = (char *)*local_a8;
      }
      this_00 = local_70;
      line = 0xcc;
      goto LAB_0010f324;
    }
    if (local_a8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_a8 != local_a8 + 2) {
        operator_delete((undefined8 *)*local_a8);
      }
      operator_delete(local_a8);
    }
    pcVar8 = "";
    local_b0 = "";
    local_a8 = (undefined8 *)0x0;
    (**(code **)(*local_78 + 0x10))(&local_b8,local_78,0,0xd,&local_b0,local_70);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c8,
               (char *)&local_90,(Status *)"rand_file->Read(0, kFileDataLen, &result, scratch)");
    if ((void *)CONCAT44(local_b8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_b8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (void *)0x0) {
      operator_delete__((void *)CONCAT44(local_b8.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_,
                                         local_b8.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._0_4_));
    }
    sVar2 = local_c8.size_;
    if ((char)local_c8.data_ == '\0') {
      testing::Message::Message(&local_b8);
      if ((undefined8 *)local_c8.size_ != (undefined8 *)0x0) {
        pcVar8 = *(char **)local_c8.size_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                 ,0xd2,pcVar8);
      testing::internal::AssertHelper::operator=(&local_90,&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      plVar4 = (long *)CONCAT44(local_b8.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_,
                                local_b8.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._0_4_);
    }
    else {
      if ((undefined8 *)local_c8.size_ != (undefined8 *)0x0) {
        if (*(undefined8 **)local_c8.size_ != (undefined8 *)(local_c8.size_ + 0x10)) {
          operator_delete(*(undefined8 **)local_c8.size_);
        }
        operator_delete((void *)sVar2);
      }
      local_b8.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = 0;
      puVar5 = (undefined8 *)strlen((char *)&local_88);
      puVar7 = local_a8;
      if (puVar5 <= local_a8) {
        puVar7 = puVar5;
      }
      uVar9 = 0xffffffff;
      if (puVar5 <= local_a8) {
        uVar9 = (uint)(puVar5 < local_a8);
      }
      uVar3 = memcmp(local_b0,&local_88,(size_t)puVar7);
      local_90.data_._0_4_ = uVar9;
      if (uVar3 != 0) {
        local_90.data_._0_4_ = uVar3;
      }
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_c8,"0","result.compare(kWrite2Data)",(int *)&local_b8,
                 (int *)&local_90);
      sVar2 = local_c8.size_;
      if ((char)local_c8.data_ != '\0') {
        if ((undefined8 *)local_c8.size_ != (undefined8 *)0x0) {
          if (*(undefined8 **)local_c8.size_ != (undefined8 *)(local_c8.size_ + 0x10)) {
            operator_delete(*(undefined8 **)local_c8.size_);
          }
          operator_delete((void *)sVar2);
        }
        if (local_78 != (long *)0x0) {
          (**(code **)(*local_78 + 8))();
        }
        goto LAB_0010f370;
      }
      testing::Message::Message(&local_b8);
      if ((undefined8 *)local_c8.size_ == (undefined8 *)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)local_c8.size_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                 ,0xd3,pcVar8);
      testing::internal::AssertHelper::operator=(&local_90,&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      plVar4 = (long *)CONCAT44(local_b8.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_,
                                local_b8.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._0_4_);
    }
    puVar7 = (undefined8 *)local_c8.size_;
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
      puVar7 = (undefined8 *)local_c8.size_;
    }
  }
  if (puVar7 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar7 != puVar7 + 2) {
      operator_delete((undefined8 *)*puVar7);
    }
    operator_delete(puVar7);
  }
LAB_0010f370:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(MemEnvTest, OverwriteOpenFile) {
  const char kWrite1Data[] = "Write #1 data";
  const size_t kFileDataLen = sizeof(kWrite1Data) - 1;
  const std::string kTestFileName = testing::TempDir() + "leveldb-TestFile.dat";

  ASSERT_LEVELDB_OK(WriteStringToFile(env_, kWrite1Data, kTestFileName));

  RandomAccessFile* rand_file;
  ASSERT_LEVELDB_OK(env_->NewRandomAccessFile(kTestFileName, &rand_file));

  const char kWrite2Data[] = "Write #2 data";
  ASSERT_LEVELDB_OK(WriteStringToFile(env_, kWrite2Data, kTestFileName));

  // Verify that overwriting an open file will result in the new file data
  // being read from files opened before the write.
  Slice result;
  char scratch[kFileDataLen];
  ASSERT_LEVELDB_OK(rand_file->Read(0, kFileDataLen, &result, scratch));
  ASSERT_EQ(0, result.compare(kWrite2Data));

  delete rand_file;
}